

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

HydroProp * __thiscall OpenMD::Sphere::getHydroProp(Sphere *this,RealType viscosity)

{
  pointer pcVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  double *pdVar8;
  HydroProp *this_00;
  long lVar9;
  uint i;
  long lVar10;
  double dVar11;
  long *local_298 [2];
  long local_288 [2];
  Vector3d local_278;
  double local_258;
  double adStack_250 [13];
  double local_1e8;
  double local_1b0;
  double local_178;
  double local_140;
  Mat6x6d local_138;
  
  dVar11 = viscosity * 18.84955592153876 * this->radius_;
  dVar2 = pow(this->radius_,3.0);
  dVar2 = dVar2 * viscosity * 25.132741228718345;
  lVar10 = 0;
  memset(adStack_250,0,0x110);
  local_258 = dVar11;
  adStack_250[6] = dVar11;
  local_1e8 = dVar11;
  local_1b0 = dVar2;
  local_178 = dVar2;
  local_140 = dVar2;
  pdVar8 = &local_258;
  do {
    lVar9 = 0;
    do {
      dVar2 = (pdVar8 + lVar9)[1];
      pdVar8[lVar9] = pdVar8[lVar9] * 14393.26479;
      (pdVar8 + lVar9)[1] = dVar2 * 14393.26479;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 6);
    lVar10 = lVar10 + 1;
    pdVar8 = pdVar8 + 6;
  } while (lVar10 != 6);
  this_00 = (HydroProp *)operator_new(0x280);
  local_278.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_278.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  local_278.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  lVar10 = 0;
  do {
    uVar3 = *(undefined8 *)((long)&local_258 + lVar10);
    uVar4 = *(undefined8 *)((long)adStack_250 + lVar10);
    uVar5 = *(undefined8 *)((long)adStack_250 + lVar10 + 8U);
    uVar6 = *(undefined8 *)((long)adStack_250 + lVar10 + 0x10U);
    uVar7 = *(undefined8 *)((long)adStack_250 + lVar10 + 0x20U);
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x20) =
         *(undefined8 *)((long)adStack_250 + lVar10 + 0x18U);
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x28) =
         uVar7;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x10) =
         uVar5;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x18) =
         uVar6;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10) = uVar3;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 8) = uVar4;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0x120);
  HydroProp::HydroProp(this_00,&local_278,&local_138);
  pcVar1 = (this->super_Shape).name_._M_dataplus._M_p;
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar1,pcVar1 + (this->super_Shape).name_._M_string_length);
  std::__cxx11::string::_M_assign((string *)this_00);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  return this_00;
}

Assistant:

HydroProp* Sphere::getHydroProp(RealType viscosity) {
    RealType Xitt = 6.0 * Constants::PI * viscosity * radius_;
    RealType Xirr = 8.0 * Constants::PI * viscosity * pow(radius_, 3);

    Mat6x6d Xi;

    Xi(0, 0) = Xitt;
    Xi(1, 1) = Xitt;
    Xi(2, 2) = Xitt;
    Xi(3, 3) = Xirr;
    Xi(4, 4) = Xirr;
    Xi(5, 5) = Xirr;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());
    return hprop;
  }